

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

xmlBufferPtr xmlBufferCreate(void)

{
  xmlChar *pxVar1;
  xmlBufferPtr ret;
  
  ret = (xmlBufferPtr)(*xmlMalloc)(0x20);
  if (ret == (xmlBufferPtr)0x0) {
    ret = (xmlBufferPtr)0x0;
  }
  else {
    ret->use = 0;
    ret->size = 0x100;
    ret->alloc = XML_BUFFER_ALLOC_IO;
    pxVar1 = (xmlChar *)(*xmlMalloc)((size_t)ret->size);
    ret->contentIO = pxVar1;
    if (ret->contentIO == (xmlChar *)0x0) {
      (*xmlFree)(ret);
      ret = (xmlBufferPtr)0x0;
    }
    else {
      ret->content = ret->contentIO;
      *ret->content = '\0';
    }
  }
  return ret;
}

Assistant:

xmlBufferPtr
xmlBufferCreate(void) {
    xmlBufferPtr ret;

    ret = xmlMalloc(sizeof(*ret));
    if (ret == NULL)
        return(NULL);

    ret->use = 0;
    ret->size = 256;
    ret->alloc = XML_BUFFER_ALLOC_IO;
    ret->contentIO = xmlMalloc(ret->size);
    if (ret->contentIO == NULL) {
	xmlFree(ret);
        return(NULL);
    }
    ret->content = ret->contentIO;
    ret->content[0] = 0;

    return(ret);
}